

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compat_gtar_large.c
# Opt level: O3

void test_compat_gtar_large(void)

{
  int iVar1;
  mode_t mVar2;
  archive *a;
  char *pcVar3;
  time_t v2;
  la_int64_t lVar4;
  archive_entry *ae;
  archive_entry *local_50;
  uchar *local_48;
  undefined8 uStack_40;
  void *local_38;
  
  local_48 = "./PaxHeaders/test.bin";
  uStack_40 = 0x100000200000600;
  local_38 = calloc(1,0x200);
  a = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                   ,L'½',(uint)(a != (archive *)0x0),"(a = archive_read_new()) != NULL",(void *)0x0
                  );
  iVar1 = archive_read_support_filter_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                      ,L'¾',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                      ,L'¿',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_open(a,&local_48,(undefined1 *)0x0,myread,(undefined1 *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                      ,L'À',0,"ARCHIVE_OK",(long)iVar1,
                      "archive_read_open(a, &reader, NULL, myread, NULL)",a);
  iVar1 = archive_read_next_header(a,&local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                      ,L'Ã',0,"ARCHIVE_OK",(long)iVar1,"r = archive_read_next_header(a, &ae)",a);
  if (iVar1 == 0) {
    pcVar3 = archive_entry_pathname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
               ,L'È',"test.bin","\"test.bin\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,
               L'\0');
    v2 = archive_entry_mtime(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'É',0x6726ec0b,"1730604043",v2,"archive_entry_mtime(ae)",(void *)0x0);
    lVar4 = archive_entry_uid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ê',0x1f5,"501",lVar4,"archive_entry_uid(ae)",(void *)0x0);
    pcVar3 = archive_entry_uname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
               ,L'Ë',"tim","\"tim\"",pcVar3,"archive_entry_uname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_gid(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ì',0x14,"20",lVar4,"archive_entry_gid(ae)",(void *)0x0);
    pcVar3 = archive_entry_gname(local_50);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
               ,L'Í',"staff","\"staff\"",pcVar3,"archive_entry_gname(ae)",(void *)0x0,L'\0');
    mVar2 = archive_entry_mode(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Î',0x81a4,"0100644",(ulong)mVar2,"archive_entry_mode(ae)",(void *)0x0);
    lVar4 = archive_entry_size(local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ï',0x200000000,"8589934592LL",lVar4,"archive_entry_size(ae)",(void *)0x0
                       );
    iVar1 = archive_read_next_header(a,&local_50);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ô',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code(a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'×',(long)iVar1,"archive_filter_code(a, 0)",0,"ARCHIVE_FILTER_NONE",
                        (void *)0x0);
    iVar1 = archive_format(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ø',(long)iVar1,"archive_format(a)",0x30002,
                        "ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE",(void *)0x0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Û',(long)uStack_40._4_4_,"reader.zero_blocks_remaining",0,"0",
                        (void *)0x0);
    iVar1 = archive_read_close(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Ý',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
    iVar1 = archive_read_free(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_compat_gtar_large.c"
                        ,L'Þ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
    free(local_38);
  }
  else {
    archive_read_free(a);
  }
  return;
}

Assistant:

DEFINE_TEST(test_compat_gtar_large)
{
	struct archive *a;
	struct archive_entry *ae;
	struct my_reader reader = {
		test_compat_gtar_large_data,
		sizeof(test_compat_gtar_large_data),
		16777218, /* 2^24 + 2 ; See above */
		NULL
	};
	int r;

	reader.zero_block = calloc(1, 512);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_open(a, &reader, NULL, myread, NULL));

	/* Read first entry. */
	assertEqualIntA(a, ARCHIVE_OK, r = archive_read_next_header(a, &ae));
	if (r != ARCHIVE_OK) {
		archive_read_free(a);
		return;
	}
	assertEqualString("test.bin", archive_entry_pathname(ae));
	assertEqualInt(1730604043, archive_entry_mtime(ae));
	assertEqualInt(501, archive_entry_uid(ae));
	assertEqualString("tim", archive_entry_uname(ae));
	assertEqualInt(20, archive_entry_gid(ae));
	assertEqualString("staff", archive_entry_gname(ae));
	assertEqualInt(0100644, archive_entry_mode(ae));
	assertEqualInt(8589934592LL, archive_entry_size(ae));

	/* TODO: Read and verify contents: 8GB of zeros */

	/* Verify the end-of-archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify that the format detection worked. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_NONE);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_TAR_PAX_INTERCHANGE);

	/* Verify that the reader actually read to the end of data */
	assertEqualInt(reader.zero_blocks_remaining, 0);

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(reader.zero_block);
}